

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O1

bool __thiscall
duckdb::Binder::TryFindBinding
          (Binder *this,string *using_column,string *join_side,BindingAlias *result)

{
  Binding *this_00;
  pointer prVar1;
  bool bVar2;
  BinderException *this_01;
  pointer prVar3;
  pointer prVar4;
  string error;
  vector<std::reference_wrapper<duckdb::Binding>,_true> bindings;
  string local_98;
  string local_78;
  string *local_58;
  BindContext *local_50;
  vector<std::reference_wrapper<duckdb::Binding>,_true> local_48;
  
  local_50 = &this->bind_context;
  local_58 = join_side;
  BindContext::GetMatchingBindings(&local_48,local_50,using_column);
  prVar1 = local_48.
           super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  prVar4 = local_48.
           super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    prVar3 = local_48.
             super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar2 = BindingAlias::IsSet(result);
      if (bVar2) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Column name \"","");
        ::std::__cxx11::string::_M_append((char *)&local_78,(ulong)(using_column->_M_dataplus)._M_p)
        ;
        ::std::__cxx11::string::append((char *)&local_78);
        ::std::__cxx11::string::_M_append((char *)&local_78,(ulong)(local_58->_M_dataplus)._M_p);
        ::std::__cxx11::string::append((char *)&local_78);
        if (local_48.
            super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_48.
            super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          prVar4 = local_48.
                   super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            this_00 = prVar4->_M_data;
            ::std::__cxx11::string::append((char *)&local_78);
            Binding::GetAlias_abi_cxx11_(&local_98,this_00);
            ::std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            ::std::__cxx11::string::append((char *)&local_78);
            BindContext::GetActualColumnName(&local_98,local_50,this_00,using_column);
            ::std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            prVar4 = prVar4 + 1;
          } while (prVar4 != local_48.
                             super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                             .
                             super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        this_01 = (BinderException *)__cxa_allocate_exception(0x10);
        BinderException::BinderException(this_01,&local_78);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::_M_assign((string *)result);
      ::std::__cxx11::string::_M_assign((string *)&result->schema);
      ::std::__cxx11::string::_M_assign((string *)&result->alias);
      prVar3 = prVar3 + 1;
    } while (prVar3 != prVar1);
  }
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return prVar4 != prVar1;
}

Assistant:

bool Binder::TryFindBinding(const string &using_column, const string &join_side, BindingAlias &result) {
	// for each using column, get the matching binding
	auto bindings = bind_context.GetMatchingBindings(using_column);
	if (bindings.empty()) {
		return false;
	}
	// find the join binding
	for (auto &binding : bindings) {
		if (result.IsSet()) {
			string error = "Column name \"";
			error += using_column;
			error += "\" is ambiguous: it exists more than once on ";
			error += join_side;
			error += " side of join.\nCandidates:";
			for (auto &binding_ref : bindings) {
				auto &other_binding = binding_ref.get();
				error += "\n\t";
				error += other_binding.GetAlias();
				error += ".";
				error += bind_context.GetActualColumnName(other_binding, using_column);
			}
			throw BinderException(error);
		} else {
			result = binding.get().alias;
		}
	}
	return true;
}